

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

void encrypt_cpa(uint8_t *out,public_key *pub,uint8_t *message,uint8_t *randomness)

{
  uint8_t *puVar1;
  uint16_t *puVar2;
  ulong uVar3;
  byte bVar4;
  int i;
  long lVar5;
  matrix *pmVar6;
  long lVar7;
  uint8_t counter;
  public_key *local_1868;
  uint8_t *local_1860;
  uint8_t input [33];
  scalar v;
  scalar expanded_message;
  vector u;
  scalar scalar_error;
  vector secret;
  vector error;
  
  counter = '\0';
  local_1860 = out;
  vector_generate_secret_eta_2(&secret,&counter,randomness);
  vector_ntt(&secret);
  vector_generate_secret_eta_2(&error,&counter,randomness);
  input._0_8_ = *(undefined8 *)randomness;
  input._8_8_ = *(undefined8 *)(randomness + 8);
  input._16_8_ = *(undefined8 *)(randomness + 0x10);
  input._24_8_ = *(undefined8 *)(randomness + 0x18);
  input[0x20] = counter;
  scalar_centered_binomial_distribution_eta_2_with_prf(&scalar_error,input);
  pmVar6 = &pub->m;
  local_1868 = pub;
  memset(&u,0,0x600);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; lVar7 != 0x600; lVar7 = lVar7 + 0x200) {
      scalar_mult(&v,(scalar *)((long)pmVar6->v[0][0].c + lVar7),
                  (scalar *)((long)secret.v[0].c + lVar7));
      scalar_add(u.v + lVar5,&v);
    }
    pmVar6 = (matrix *)(pmVar6->v + 1);
  }
  for (lVar5 = 0; lVar5 != 0x600; lVar5 = lVar5 + 0x200) {
    scalar_inverse_ntt((scalar *)((long)u.v[0].c + lVar5));
  }
  vector_add(&u,&error);
  scalar_inner_product(&v,&local_1868->t,&secret);
  scalar_inverse_ntt(&v);
  scalar_add(&v,&scalar_error);
  puVar2 = expanded_message.c;
  for (uVar3 = 0; uVar3 < 0x100; uVar3 = uVar3 + 8) {
    bVar4 = *message;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      puVar2[lVar5] = (ushort)(bVar4 & 1);
      bVar4 = bVar4 >> 1;
    }
    message = message + 1;
    puVar2 = puVar2 + 8;
  }
  scalar_decompress(&expanded_message,1);
  scalar_add(&v,&expanded_message);
  for (lVar5 = 0; puVar1 = local_1860, lVar5 != 0x600; lVar5 = lVar5 + 0x200) {
    scalar_compress((scalar *)((long)u.v[0].c + lVar5),10);
  }
  vector_encode(local_1860,&u,10);
  scalar_compress(&v,4);
  scalar_encode(puVar1 + 0x3c0,&v,4);
  return;
}

Assistant:

static void encrypt_cpa(uint8_t out[KYBER_CIPHERTEXT_BYTES],
                        const struct public_key *pub, const uint8_t message[32],
                        const uint8_t randomness[32]) {
  uint8_t counter = 0;
  vector secret;
  vector_generate_secret_eta_2(&secret, &counter, randomness);
  vector_ntt(&secret);
  vector error;
  vector_generate_secret_eta_2(&error, &counter, randomness);
  uint8_t input[33];
  OPENSSL_memcpy(input, randomness, 32);
  input[32] = counter;
  scalar scalar_error;
  scalar_centered_binomial_distribution_eta_2_with_prf(&scalar_error, input);
  vector u;
  matrix_mult(&u, &pub->m, &secret);
  vector_inverse_ntt(&u);
  vector_add(&u, &error);
  scalar v;
  scalar_inner_product(&v, &pub->t, &secret);
  scalar_inverse_ntt(&v);
  scalar_add(&v, &scalar_error);
  scalar expanded_message;
  scalar_decode_1(&expanded_message, message);
  scalar_decompress(&expanded_message, 1);
  scalar_add(&v, &expanded_message);
  vector_compress(&u, kDU);
  vector_encode(out, &u, kDU);
  scalar_compress(&v, kDV);
  scalar_encode(out + kCompressedVectorSize, &v, kDV);
}